

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O0

PBuffer __thiscall ConvertorPCM2WAV::convert(ConvertorPCM2WAV *this)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t sVar3;
  size_t sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ConvertorPCM2WAV *in_RSI;
  PBuffer PVar5;
  shared_ptr<Buffer> local_e0;
  allocator<char> local_c9;
  string local_c8;
  shared_ptr<Buffer> local_a8;
  allocator<char> local_91;
  string local_90;
  shared_ptr<Buffer> local_60;
  undefined1 local_50 [8];
  PBuffer data;
  PBuffer header;
  shared_ptr<MutableBuffer> local_28;
  ConvertorPCM2WAV *this_local;
  
  this_local = this;
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)&local_28);
  std::shared_ptr<MutableBuffer>::operator=(&in_RSI->result,&local_28);
  std::shared_ptr<MutableBuffer>::~shared_ptr(&local_28);
  create_header((ConvertorPCM2WAV *)
                &data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Buffer>::shared_ptr(&local_60,&(in_RSI->super_Convertor).buffer);
  (*(in_RSI->super_Convertor)._vptr_Convertor[3])(local_50,in_RSI,&local_60);
  std::shared_ptr<Buffer>::~shared_ptr(&local_60);
  peVar1 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&in_RSI->result);
  MutableBuffer::push(peVar1,"RIFF");
  peVar1 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&in_RSI->result);
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar3 = Buffer::get_size(peVar2);
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_50);
  sVar4 = Buffer::get_size(peVar2);
  MutableBuffer::push<unsigned_int>(peVar1,(int)sVar3 + 0x14 + (int)sVar4,1);
  peVar1 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&in_RSI->result);
  MutableBuffer::push(peVar1,"WAVE");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"fmt ",&local_91);
  std::shared_ptr<Buffer>::shared_ptr
            (&local_a8,
             (shared_ptr<Buffer> *)
             &data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  write_chunk(in_RSI,&local_90,&local_a8);
  std::shared_ptr<Buffer>::~shared_ptr(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"data",&local_c9);
  std::shared_ptr<Buffer>::shared_ptr(&local_e0,(shared_ptr<Buffer> *)local_50);
  write_chunk(in_RSI,&local_c8,&local_e0);
  std::shared_ptr<Buffer>::~shared_ptr(&local_e0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::shared_ptr<Buffer>::shared_ptr<MutableBuffer,void>
            ((shared_ptr<Buffer> *)this,&in_RSI->result);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_50);
  std::shared_ptr<Buffer>::~shared_ptr
            ((shared_ptr<Buffer> *)
             &data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar5.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar5.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorPCM2WAV::convert() {
  result = std::make_shared<MutableBuffer>(Buffer::EndianessLittle);

  PBuffer header = create_header();
  PBuffer data = create_data(buffer);

  result->push("RIFF");
  result->push<uint32_t>(static_cast<uint32_t>(header->get_size() +
                                               data->get_size() + 20));
  result->push("WAVE");
  write_chunk("fmt ", header);
  write_chunk("data", data);

  return result;
}